

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_BnB_Node.cpp
# Opt level: O2

string * __thiscall
BGIP_BnB_Node::SoftPrintPartiallySpecifiedPolicy_abi_cxx11_
          (string *__return_storage_ptr__,BGIP_BnB_Node *this,
          BayesianGameIdenticalPayoffInterface *bgip,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jtIndexMapping)

{
  Index jTypeI;
  uint uVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  uint uVar4;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  for (uVar1 = 0; uVar1 != this->_m_depth; uVar1 = uVar1 + 1) {
    jTypeI = (jtIndexMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar1];
    poVar2 = std::operator<<(local_1a8,"\tjt=");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," [");
    pvVar3 = BayesianGameBase::JointToIndividualTypeIndices(&bgip->super_BayesianGameBase,jTypeI);
    for (uVar4 = 0;
        (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)uVar4; uVar4 = uVar4 + 1) {
      poVar2 = std::operator<<(local_1a8," (");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,"->");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,")");
    }
    poVar2 = std::operator<<(local_1a8,"]");
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string BGIP_BnB_Node::SoftPrintPartiallySpecifiedPolicy(
    BayesianGameIdenticalPayoffInterface *bgip,
    const vector<Index> & jtIndexMapping

        ) const
{
    std::stringstream ss;
#if 1
    for(Index jt_oI=0;jt_oI!=_m_depth;++jt_oI)
    {
        Index jt;
#if DYNAMIC_JT_INDEX_MAPPING
        if(_m_jtIndexMapping)
            jt=(*_m_jtIndexMapping)[jt_oI];
        else
#endif
            jt=jtIndexMapping[jt_oI];
        ss << "\tjt=" << jt << " [";
        const std::vector<Index> &indTypes=
            bgip->JointToIndividualTypeIndices( jt );
        for(Index i=0;i!=indTypes.size();++i)
        {
            ss << " (" << indTypes[i] << "->"
               << GetAction(i) << ")";
        }
        ss << "]" << "\n";
    }
#else
    for(Index jt=0;jt!=_m_depth;++jt)
    {
        ss << "jt " << _m_jtIndexMapping[jt] << " [";
        const std::vector<Index> &indTypes=
            bgip->JointToIndividualTypeIndices(
                _m_jtIndexMapping[jt]);
        for(Index i=0;i!=indTypes.size();++i)
        {
            ss << " (" << indTypes[i] << "->"
               << GetAction(i) << ")";
        }
        ss << "]" << "\t";
    }
#endif
    return(ss.str());
}